

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManPrint_rec(FILE *pFile,If_DsdMan_t *p,int iDsdLit,uchar *pPermLits,int *pnSupp)

{
  int iVar1;
  If_DsdObj_t *pObj_00;
  word *pTruth;
  char *pcVar2;
  bool bVar3;
  uint local_6c;
  int local_50;
  int iPermLit;
  int iFanin;
  int i;
  If_DsdObj_t *pObj;
  undefined1 local_38;
  char cStack_37;
  char CloseType [7];
  char OpenType [7];
  int *pnSupp_local;
  uchar *pPermLits_local;
  int iDsdLit_local;
  If_DsdMan_t *p_local;
  FILE *pFile_local;
  
  _cStack_37 = 0x28000000;
  CloseType[3] = '[';
  CloseType[4] = '<';
  CloseType[5] = '{';
  pObj._2_4_ = 0x29000000;
  pObj._6_2_ = 0x3e5d;
  local_38 = 0x7d;
  unique0x10000274 = pnSupp;
  iVar1 = Abc_LitIsCompl(iDsdLit);
  pcVar2 = "";
  if (iVar1 != 0) {
    pcVar2 = "!";
  }
  fprintf((FILE *)pFile,"%s",pcVar2);
  iVar1 = Abc_Lit2Var(iDsdLit);
  pObj_00 = If_DsdVecObj(&p->vObjs,iVar1);
  iVar1 = If_DsdObjType(pObj_00);
  if (iVar1 == 1) {
    fprintf((FILE *)pFile,"0");
  }
  else {
    iVar1 = If_DsdObjType(pObj_00);
    if (iVar1 == 2) {
      if (pPermLits == (uchar *)0x0) {
        iVar1 = *stack0xffffffffffffffd0;
        *stack0xffffffffffffffd0 = iVar1 + 1;
        local_6c = Abc_Var2Lit(iVar1,0);
      }
      else {
        iVar1 = *stack0xffffffffffffffd0;
        *stack0xffffffffffffffd0 = iVar1 + 1;
        local_6c = (uint)pPermLits[iVar1];
      }
      iVar1 = Abc_LitIsCompl(local_6c);
      pcVar2 = "";
      if (iVar1 != 0) {
        pcVar2 = "!";
      }
      iVar1 = Abc_Lit2Var(local_6c);
      fprintf((FILE *)pFile,"%s%c",pcVar2,(ulong)(iVar1 + 0x61));
    }
    else {
      iVar1 = If_DsdObjType(pObj_00);
      if (iVar1 == 6) {
        pTruth = If_DsdObjTruth(p,pObj_00);
        iVar1 = If_DsdObjFaninNum(pObj_00);
        Abc_TtPrintHexRev(pFile,pTruth,iVar1);
      }
      iVar1 = If_DsdObjType(pObj_00);
      fprintf((FILE *)pFile,"%c",(ulong)(uint)(int)CloseType[(long)iVar1 + -1]);
      iPermLit = 0;
      while( true ) {
        iVar1 = If_DsdObjFaninNum(pObj_00);
        bVar3 = false;
        if (iPermLit < iVar1) {
          local_50 = If_DsdObjFaninLit(pObj_00,iPermLit);
          bVar3 = local_50 != 0;
        }
        if (!bVar3) break;
        If_DsdManPrint_rec(pFile,p,local_50,pPermLits,stack0xffffffffffffffd0);
        iPermLit = iPermLit + 1;
      }
      iVar1 = If_DsdObjType(pObj_00);
      fprintf((FILE *)pFile,"%c",(ulong)(uint)(int)*(char *)((long)&pObj + (long)iVar1 + 2));
    }
  }
  return;
}

Assistant:

void If_DsdManPrint_rec( FILE * pFile, If_DsdMan_t * p, int iDsdLit, unsigned char * pPermLits, int * pnSupp )
{
    char OpenType[7]  = {0, 0, 0, '(', '[', '<', '{'};
    char CloseType[7] = {0, 0, 0, ')', ']', '>', '}'};
    If_DsdObj_t * pObj;
    int i, iFanin;
    fprintf( pFile, "%s", Abc_LitIsCompl(iDsdLit) ? "!" : ""  );
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsdLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        { fprintf( pFile, "0" ); return; }
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[(*pnSupp)++] : Abc_Var2Lit((*pnSupp)++, 0);
        fprintf( pFile, "%s%c", Abc_LitIsCompl(iPermLit)? "!":"", 'a' + Abc_Lit2Var(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
        Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), If_DsdObjFaninNum(pObj) );
    fprintf( pFile, "%c", OpenType[If_DsdObjType(pObj)] );
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        If_DsdManPrint_rec( pFile, p, iFanin, pPermLits, pnSupp );
    fprintf( pFile, "%c", CloseType[If_DsdObjType(pObj)] );
}